

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderVertexOrdering.cpp
# Opt level: O1

void __thiscall
glcts::TessellationShaderVertexOrdering::verifyVertexOrderingDoesNotChangeGeneratedPoints
          (TessellationShaderVertexOrdering *this,_test_iteration *test_iteration_a,
          _test_iteration *test_iteration_b)

{
  ostringstream *poVar1;
  ostringstream *this_00;
  char *pcVar2;
  char *pcVar3;
  MessageBuilder *this_01;
  TestError *this_02;
  _tessellation_shader_vertex_ordering vertex_ordering_00;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  bool bVar8;
  ulong uVar9;
  bool bVar10;
  float fVar11;
  float fVar12;
  string primitive_mode;
  string vertex_ordering;
  pointer local_1f0;
  string local_1e8;
  string local_1c8;
  undefined1 local_1a8 [120];
  ios_base local_130 [264];
  
  if ((ulong)test_iteration_a->n_vertices != 0) {
    pcVar2 = test_iteration_a->data;
    pcVar3 = test_iteration_b->data;
    uVar4 = 0;
    do {
      if ((ulong)test_iteration_b->n_vertices == 0) {
LAB_00cd5706:
        TessellationShaderUtils::getESTokenForPrimitiveMode_abi_cxx11_
                  (&local_1e8,(TessellationShaderUtils *)(ulong)test_iteration_a->primitive_mode,
                   (_tessellation_primitive_mode)pcVar3);
        TessellationShaderUtils::getESTokenForVertexOrderingMode_abi_cxx11_
                  (&local_1c8,(TessellationShaderUtils *)(ulong)test_iteration_a->vertex_ordering,
                   vertex_ordering_00);
        local_1a8._0_8_ =
             ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        this_00 = (ostringstream *)(local_1a8 + 8);
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,"For primitive mode: [",0x15);
        local_1f0 = local_1e8._M_dataplus._M_p;
        this_01 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1a8,&local_1f0);
        poVar1 = &this_01->m_str;
        std::__ostream_insert<char,std::char_traits<char>>
                  (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                   "] and inner tessellation levels: [",0x22);
        std::ostream::_M_insert<double>((double)test_iteration_a->inner_tess_levels[0]);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", ",2);
        std::ostream::_M_insert<double>((double)test_iteration_a->inner_tess_levels[1]);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                   "] and outer tessellation levels: [",0x22);
        std::ostream::_M_insert<double>((double)test_iteration_a->outer_tess_levels[0]);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", ",2);
        std::ostream::_M_insert<double>((double)test_iteration_a->outer_tess_levels[1]);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", ",2);
        std::ostream::_M_insert<double>((double)test_iteration_a->outer_tess_levels[2]);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", ",2);
        std::ostream::_M_insert<double>((double)test_iteration_a->outer_tess_levels[3]);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"] ",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                   ", vertices generated for CW and CCW orientations do not match.",0x3e);
        tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(this_00);
        std::ios_base::~ios_base(local_130);
        this_02 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_02,
                   "For runs in which only vertex ordering setting differs, vertex from one run was not found in the other run."
                   ,(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderVertexOrdering.cpp"
                   ,0x2db);
        __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      uVar5 = (ulong)(uint)((int)uVar4 * 3);
      uVar7 = 0;
      bVar8 = false;
      uVar6 = 1;
      do {
        uVar9 = (ulong)uVar7;
        fVar11 = *(float *)(pcVar2 + uVar5 * 4) - *(float *)(pcVar3 + uVar9 * 4);
        fVar12 = -fVar11;
        if (-fVar11 <= fVar11) {
          fVar12 = fVar11;
        }
        if (1e-05 <= fVar12) {
LAB_00cd56cc:
          bVar10 = true;
        }
        else {
          fVar11 = *(float *)(pcVar2 + uVar5 * 4 + 4) - *(float *)(pcVar3 + uVar9 * 4 + 4);
          fVar12 = -fVar11;
          if (-fVar11 <= fVar11) {
            fVar12 = fVar11;
          }
          if (1e-05 <= fVar12) goto LAB_00cd56cc;
          fVar11 = *(float *)(pcVar2 + uVar5 * 4 + 8) - *(float *)(pcVar3 + uVar9 * 4 + 8);
          fVar12 = -fVar11;
          if (-fVar11 <= fVar11) {
            fVar12 = fVar11;
          }
          if (1e-05 <= fVar12) goto LAB_00cd56cc;
          bVar8 = true;
          bVar10 = false;
        }
        if (!bVar10) break;
        uVar7 = uVar7 + 3;
        bVar10 = uVar6 < test_iteration_b->n_vertices;
        uVar6 = uVar6 + 1;
      } while (bVar10);
      if (!bVar8) goto LAB_00cd5706;
      uVar4 = uVar4 + 1;
    } while (uVar4 != test_iteration_a->n_vertices);
  }
  return;
}

Assistant:

void TessellationShaderVertexOrdering::verifyVertexOrderingDoesNotChangeGeneratedPoints(
	const _test_iteration& test_iteration_a, const _test_iteration& test_iteration_b)
{
	const float epsilon = 1e-5f;

	/* Sanity checks */
	DE_ASSERT(test_iteration_a.is_point_mode_enabled);
	DE_ASSERT(test_iteration_b.is_point_mode_enabled);
	DE_ASSERT(test_iteration_a.vertex_ordering == TESSELLATION_SHADER_VERTEX_ORDERING_CCW ||
			  test_iteration_a.vertex_ordering == TESSELLATION_SHADER_VERTEX_ORDERING_DEFAULT);
	DE_ASSERT(test_iteration_b.vertex_ordering == TESSELLATION_SHADER_VERTEX_ORDERING_CW);

	/* Iterate through all points in test set A and make sure they can be found in test set B */
	for (unsigned int n_vertex_a = 0; n_vertex_a < test_iteration_a.n_vertices; ++n_vertex_a)
	{
		bool		 has_been_found = false;
		const float* vertex_a_data  = (const float*)test_iteration_a.data + n_vertex_a * 3 /* components */;

		for (unsigned int n_vertex_b = 0; n_vertex_b < test_iteration_b.n_vertices; ++n_vertex_b)
		{
			const float* vertex_b_data = (const float*)test_iteration_b.data + n_vertex_b * 3 /* components */;

			if (de::abs(vertex_a_data[0] - vertex_b_data[0]) < epsilon &&
				de::abs(vertex_a_data[1] - vertex_b_data[1]) < epsilon &&
				de::abs(vertex_a_data[2] - vertex_b_data[2]) < epsilon)
			{
				has_been_found = true;

				break;
			}
		} /* for (all B set vertices) */

		if (!has_been_found)
		{
			std::string primitive_mode =
				TessellationShaderUtils::getESTokenForPrimitiveMode(test_iteration_a.primitive_mode);
			std::string vertex_ordering =
				TessellationShaderUtils::getESTokenForVertexOrderingMode(test_iteration_a.vertex_ordering);

			m_testCtx.getLog() << tcu::TestLog::Message << "For primitive mode: [" << primitive_mode.c_str()
							   << "] "
								  "and inner tessellation levels:"
								  " ["
							   << test_iteration_a.inner_tess_levels[0] << ", " << test_iteration_a.inner_tess_levels[1]
							   << "] "
								  "and outer tessellation levels:"
								  " ["
							   << test_iteration_a.outer_tess_levels[0] << ", " << test_iteration_a.outer_tess_levels[1]
							   << ", " << test_iteration_a.outer_tess_levels[2] << ", "
							   << test_iteration_a.outer_tess_levels[3] << "] "
							   << ", vertices generated for CW and CCW orientations do not match."
							   << tcu::TestLog::EndMessage;

			TCU_FAIL("For runs in which only vertex ordering setting differs, vertex from one run was not found in the "
					 "other run.");
		}
	} /* for (all A set vertices) */
}